

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O1

void __thiscall argsman_tests::util_NoIncludeConf::test_method(util_NoIncludeConf *this)

{
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  lazy_ostream local_110;
  undefined1 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined1 *local_b8;
  char **local_b0;
  string *local_a8;
  undefined **local_a0;
  undefined1 local_98;
  undefined1 *local_90;
  string **local_88;
  char *local_80;
  char *local_78;
  assertion_result local_70;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xcc;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  NoIncludeConfTest::Parse_abi_cxx11_(&local_58,(NoIncludeConfTest *)this,"-noincludeconf");
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"");
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_78 = "";
  local_88 = &local_a8;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013d3d70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  local_d0 = "";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013d42f0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_110,1,2,REQUIRE,0xe821ed,(size_t)&local_80,0xcc,&local_a0,"\"\"",
             &local_c8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xcd;
  file_00.m_begin = (iterator)&local_120;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
             msg_00);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  NoIncludeConfTest::Parse_abi_cxx11_(&local_58,(NoIncludeConfTest *)this,"-includeconf");
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"-includeconf cannot be used from commandline; -includeconf=\"\"");
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_78 = "";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013d3d70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_a8;
  local_d0 = "-includeconf cannot be used from commandline; -includeconf=\"\"";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013d4330;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_110,1,2,REQUIRE,0xe82212,(size_t)&local_80,0xcd,&local_a0,
             "\"-includeconf cannot be used from commandline; -includeconf=\\\"\\\"\"",&local_c8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xce;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  local_110.m_empty = false;
  local_110._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  NoIncludeConfTest::Parse_abi_cxx11_(&local_58,(NoIncludeConfTest *)this,"-includeconf=file");
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"-includeconf cannot be used from commandline; -includeconf=\"file\""
                    );
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/argsman_tests.cpp";
  local_78 = "";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013d3d70;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_a8;
  local_d0 = "-includeconf cannot be used from commandline; -includeconf=\"file\"";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013d4370;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  local_a8 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_110,1,2,REQUIRE,0xe822ba,(size_t)&local_80,0xce,&local_a0,
             "\"-includeconf cannot be used from commandline; -includeconf=\\\"file\\\"\"",&local_c8
            );
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_NoIncludeConf, NoIncludeConfTest)
{
    BOOST_CHECK_EQUAL(Parse("-noincludeconf"), "");
    BOOST_CHECK_EQUAL(Parse("-includeconf"), "-includeconf cannot be used from commandline; -includeconf=\"\"");
    BOOST_CHECK_EQUAL(Parse("-includeconf=file"), "-includeconf cannot be used from commandline; -includeconf=\"file\"");
}